

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O0

Matrix4x4 * __thiscall CMU462::Matrix4x4::operator-(Matrix4x4 *this)

{
  double *pdVar1;
  double dVar2;
  Matrix4x4 *this_00;
  double dVar3;
  Matrix4x4 *in_RDI;
  Matrix4x4 *A;
  Matrix4x4 *B;
  undefined8 in_stack_ffffffffffffff58;
  Matrix4x4 *in_stack_ffffffffffffff60;
  Matrix4x4 *in_stack_ffffffffffffff70;
  
  Matrix4x4(in_stack_ffffffffffffff70);
  pdVar1 = operator()(in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                      (int)in_stack_ffffffffffffff58);
  dVar2 = -*pdVar1;
  pdVar1 = operator()(in_stack_ffffffffffffff60,(int)((ulong)dVar2 >> 0x20),SUB84(*pdVar1,0));
  *pdVar1 = dVar2;
  pdVar1 = operator()(in_stack_ffffffffffffff60,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
  this_00 = (Matrix4x4 *)((ulong)*pdVar1 ^ 0x8000000000000000);
  pdVar1 = operator()(this_00,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
  *pdVar1 = (double)this_00;
  pdVar1 = operator()(this_00,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
  dVar3 = *pdVar1;
  pdVar1 = operator()(this_00,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
  *pdVar1 = -dVar3;
  pdVar1 = operator()(this_00,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
  dVar3 = -*pdVar1;
  pdVar1 = operator()(this_00,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
  *pdVar1 = dVar3;
  pdVar1 = operator()(this_00,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
  dVar3 = *pdVar1;
  pdVar1 = operator()(this_00,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
  *pdVar1 = -dVar3;
  pdVar1 = operator()(this_00,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
  dVar3 = *pdVar1;
  pdVar1 = operator()(this_00,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
  *pdVar1 = -dVar3;
  pdVar1 = operator()(this_00,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
  dVar3 = *pdVar1;
  pdVar1 = operator()(this_00,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
  *pdVar1 = -dVar3;
  pdVar1 = operator()(this_00,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
  dVar3 = *pdVar1;
  pdVar1 = operator()(this_00,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
  *pdVar1 = -dVar3;
  pdVar1 = operator()(this_00,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
  dVar3 = *pdVar1;
  pdVar1 = operator()(this_00,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
  *pdVar1 = -dVar3;
  pdVar1 = operator()(this_00,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
  dVar3 = *pdVar1;
  pdVar1 = operator()(this_00,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
  *pdVar1 = -dVar3;
  pdVar1 = operator()(this_00,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
  dVar3 = *pdVar1;
  pdVar1 = operator()(this_00,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
  *pdVar1 = -dVar3;
  pdVar1 = operator()(this_00,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
  dVar3 = *pdVar1;
  pdVar1 = operator()(this_00,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
  *pdVar1 = -dVar3;
  pdVar1 = operator()(this_00,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
  dVar3 = *pdVar1;
  pdVar1 = operator()(this_00,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
  *pdVar1 = -dVar3;
  pdVar1 = operator()(this_00,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
  dVar3 = *pdVar1;
  pdVar1 = operator()(this_00,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
  *pdVar1 = -dVar3;
  pdVar1 = operator()(this_00,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
  dVar3 = *pdVar1;
  pdVar1 = operator()(this_00,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
  *pdVar1 = -dVar3;
  pdVar1 = operator()(this_00,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
  dVar3 = *pdVar1;
  pdVar1 = operator()(this_00,(int)((ulong)dVar2 >> 0x20),SUB84(dVar2,0));
  *pdVar1 = -dVar3;
  return in_RDI;
}

Assistant:

Matrix4x4 Matrix4x4::operator-( void ) const {

  // returns -A (Negation).
  const Matrix4x4& A( *this );
  Matrix4x4 B;

  B(0,0) = -A(0,0); B(0,1) = -A(0,1); B(0,2) = -A(0,2); B(0,3) = -A(0,3);
  B(1,0) = -A(1,0); B(1,1) = -A(1,1); B(1,2) = -A(1,2); B(1,3) = -A(1,3);
  B(2,0) = -A(2,0); B(2,1) = -A(2,1); B(2,2) = -A(2,2); B(2,3) = -A(2,3);
	B(3,0) = -A(3,0); B(3,1) = -A(3,1); B(3,2) = -A(3,2); B(3,3) = -A(3,3);

    return B;
  }